

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

int imm_move_p(MIR_insn_t insn)

{
  byte bVar1;
  int iVar2;
  
  iVar2 = 0;
  if ((((*(uint *)&insn->field_0x18 & 0xfffffffc) == 0) && (insn->ops[0].field_0x8 == '\x02')) &&
     (0x21 < insn->ops[0].u.reg)) {
    bVar1 = *(byte *)&insn[1].insn_link.prev;
    iVar2 = 1;
    if (4 < (ushort)(bVar1 - 3)) {
      return (int)(bVar1 == 8);
    }
  }
  return iVar2;
}

Assistant:

static int imm_move_p (MIR_insn_t insn) {
  return (move_code_p (insn->code) && insn->ops[0].mode == MIR_OP_VAR
          && insn->ops[0].u.var > MAX_HARD_REG
          && (insn->ops[1].mode == MIR_OP_INT || insn->ops[1].mode == MIR_OP_UINT
              || insn->ops[1].mode == MIR_OP_FLOAT || insn->ops[1].mode == MIR_OP_DOUBLE
              || insn->ops[1].mode == MIR_OP_LDOUBLE || insn->ops[1].mode == MIR_OP_REF));
}